

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

fdb_status
filemgr_close(filemgr *file,bool cleanup_cache_onclose,char *orig_file_name,
             err_log_callback *log_callback)

{
  atomic<unsigned_int> *paVar1;
  pthread_spinlock_t *__lock;
  int iVar2;
  fdb_status io_error;
  hash_elem *phVar3;
  hash_elem *phVar4;
  bool bVar5;
  filemgr query;
  filemgr query_old;
  
  LOCK();
  paVar1 = &file->ref_count;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
  UNLOCK();
  if ((paVar1->super___atomic_base<unsigned_int>)._M_i != 0) {
    return FDB_RESULT_SUCCESS;
  }
  io_error = FDB_RESULT_SUCCESS;
  fdb_log_impl(log_callback,4,FDB_RESULT_SUCCESS,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
               ,"filemgr_close",0x5c2,"Forestdb closed database file %s, ref count %zu",
               file->filename,(ulong)(file->ref_count).super___atomic_base<unsigned_int>._M_i);
  pthread_spin_lock(&filemgr_openlock);
  __lock = &file->lock;
  pthread_spin_lock(__lock);
  if ((file->ref_count).super___atomic_base<unsigned_int>._M_i != 0) goto LAB_0010938c;
  if ((global_config.ncacheblock < 1) ||
     (bVar5 = true, (file->status).super___atomic_base<unsigned_char>._M_i == '\x04')) {
    bVar5 = false;
  }
  pthread_spin_unlock(__lock);
  iVar2 = wal_is_initialized(file);
  if (iVar2 != 0) {
    wal_close(file,log_callback);
  }
  if (bVar5) {
    bcache_remove_dirty_blocks(file);
  }
  pthread_spin_lock(__lock);
  if ((file->status).super___atomic_base<unsigned_char>._M_i == '\x04') {
    if (file->new_filename == (char *)0x0) {
      phVar4 = (hash_elem *)0x0;
    }
    else {
      query.filename = file->new_filename;
      phVar3 = hash_find(&hash,&query.e);
      phVar4 = phVar3 + -10;
      if (phVar3 == (hash_elem *)0x0) {
        phVar4 = (hash_elem *)0x0;
      }
    }
    if (lazy_file_deletion_enabled == true) {
      bVar5 = false;
      if (phVar4 == (hash_elem *)0x0) {
        io_error = FDB_RESULT_SUCCESS;
      }
      else {
        io_error = FDB_RESULT_SUCCESS;
        if (*(char *)&phVar4[0xf].avl.parent == '\x01') goto LAB_00109254;
      }
    }
    else {
LAB_00109254:
      io_error = (*file->ops->close)(file->fd);
      _log_errno_str(file->ops,log_callback,io_error,"CLOSE",file->filename);
      bVar5 = true;
    }
    pthread_spin_unlock(__lock);
    phVar4 = hash_remove(&hash,&file->e);
    if (phVar4 == (hash_elem *)0x0) {
      fdb_assert_die("ret",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                     ,0x608,0,0);
    }
    pthread_spin_unlock(&filemgr_openlock);
    if (bVar5) {
LAB_0010937e:
      filemgr_free_func(&file->e);
    }
    else {
      (*register_file_removal)(file,log_callback);
    }
    bVar5 = false;
  }
  else {
    io_error = (*file->ops->close)(file->fd);
    if (cleanup_cache_onclose) {
      _log_errno_str(file->ops,log_callback,io_error,"CLOSE",file->filename);
      if ((orig_file_name != (char *)0x0) && (file->in_place_compaction != false)) {
        query.filename = orig_file_name;
        phVar4 = hash_find(&hash,&query.e);
        if ((file->old_filename == (char *)0x0) ||
           (query_old.filename = file->old_filename, phVar3 = hash_find(&hash,&query_old.e),
           phVar3 == (hash_elem *)0x0)) {
          bVar5 = true;
        }
        else {
          bVar5 = *(int *)&phVar3[-10].avl.left == 0;
        }
        if ((((phVar4 == (hash_elem *)0x0) && (bVar5)) &&
            (bVar5 = (*is_file_removed)(orig_file_name), bVar5)) &&
           (iVar2 = rename(file->filename,orig_file_name), iVar2 < 0)) {
          _log_errno_str(file->ops,log_callback,FDB_RESULT_FILE_RENAME_FAIL,"CLOSE",file->filename);
        }
      }
      pthread_spin_unlock(__lock);
      phVar4 = hash_remove(&hash,&file->e);
      if (phVar4 == (hash_elem *)0x0) {
        fdb_assert_die("ret",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,0x640,(uint64_t)file,0);
      }
      pthread_spin_unlock(&filemgr_openlock);
      goto LAB_0010937e;
    }
    LOCK();
    (file->status).super___atomic_base<unsigned_char>._M_i = '\x03';
    UNLOCK();
    bVar5 = true;
  }
  if (!bVar5) {
    return io_error;
  }
LAB_0010938c:
  _log_errno_str(file->ops,log_callback,io_error,"CLOSE",file->filename);
  pthread_spin_unlock(__lock);
  pthread_spin_unlock(&filemgr_openlock);
  return io_error;
}

Assistant:

fdb_status filemgr_close(struct filemgr *file, bool cleanup_cache_onclose,
                         const char *orig_file_name,
                         err_log_callback *log_callback)
{
    int rv = FDB_RESULT_SUCCESS;

    if (atomic_decr_uint32_t(&file->ref_count) > 0) {
        // File is still accessed by other readers or writers.
        return FDB_RESULT_SUCCESS;
    }

    fdb_log(log_callback, FDB_LOG_INFO, (fdb_status)rv,
            "Forestdb closed database file %s, ref count %zu",
            file->filename,
            atomic_get_uint32_t(&file->ref_count));

    spin_lock(&filemgr_openlock); // Grab the filemgr lock to avoid the race with
                                  // filemgr_open() because file->lock won't
                                  // prevent the race condition.

    // remove filemgr structure if no thread refers to the file
    spin_lock(&file->lock);
    if (atomic_get_uint32_t(&file->ref_count) == 0) {
        bool need_to_purge_dirty_blocks = false;
        if (global_config.ncacheblock > 0 &&
            atomic_get_uint8_t(&file->status) != FILE_REMOVED_PENDING) {
            spin_unlock(&file->lock);
            // discard all dirty blocks belonged to this file
            need_to_purge_dirty_blocks = true;

        } else {
            // If the file is in pending removal (i.e., FILE_REMOVED_PENDING),
            // then its dirty block entries will be cleaned up in either
            // filemgr_free_func() or register_file_removal() below.
            spin_unlock(&file->lock);
        }

        // WARNING: Closing WAL should be done before
        //          purging dirty blocks.
        if (wal_is_initialized(file)) {
            wal_close(file, log_callback);
        }

        if (need_to_purge_dirty_blocks) {
            bcache_remove_dirty_blocks(file);
        }

#ifdef _LATENCY_STATS_DUMP_TO_FILE
        filemgr_dump_latency_stat(file, log_callback);
#endif // _LATENCY_STATS_DUMP_TO_FILE

        spin_lock(&file->lock);

        if (atomic_get_uint8_t(&file->status) == FILE_REMOVED_PENDING) {

            bool foreground_deletion = false;
            struct filemgr* new_file = get_instance_UNLOCKED(file->new_filename);

            // immediately remove file if background remove function is not set
            if (!lazy_file_deletion_enabled ||
                (new_file && new_file->in_place_compaction)) {
                // TODO: to avoid the scenario below, we prevent background
                //       deletion of in-place compacted files at this time.
                // 1) In-place compacted from 'A' to 'A.1'.
                // 2) Request to delete 'A'.
                // 3) Close 'A.1'; since 'A' is not deleted yet, 'A.1' is not renamed.
                // 4) User opens DB file using its original name 'A', not 'A.1'.
                // 5) Old file 'A' is opened, and then background thread deletes 'A'.
                // 6) Crash!

                // As the file is already unlinked, the file will be removed
                // as soon as we close it.
                rv = file->ops->close(file->fd);
                _log_errno_str(file->ops, log_callback, (fdb_status)rv, "CLOSE", file->filename);
#if defined(WIN32) || defined(_WIN32)
                // For Windows, we need to manually remove the file.
                remove(file->filename);
#endif
                foreground_deletion = true;
            }

            // we can release lock becuase no one will open this file
            spin_unlock(&file->lock);
            struct hash_elem *ret = hash_remove(&hash, &file->e);
            fdb_assert(ret, 0, 0);

            spin_unlock(&filemgr_openlock);

            if (foreground_deletion) {
                filemgr_free_func(&file->e);
            } else {
                register_file_removal(file, log_callback);
            }
            return (fdb_status) rv;
        } else {

            rv = file->ops->close(file->fd);
            if (cleanup_cache_onclose) {
                _log_errno_str(file->ops, log_callback, (fdb_status)rv, "CLOSE", file->filename);
                if (file->in_place_compaction && orig_file_name) {
                    struct hash_elem *elem = NULL;
                    struct filemgr query;
                    uint32_t old_file_refcount = 0;

                    query.filename = (char *)orig_file_name;
                    elem = hash_find(&hash, &query.e);

                    if (file->old_filename) {
                        struct hash_elem *elem_old = NULL;
                        struct filemgr query_old;
                        struct filemgr *old_file = NULL;

                        // get old file's ref count if exists
                        query_old.filename = file->old_filename;
                        elem_old = hash_find(&hash, &query_old.e);
                        if (elem_old) {
                            old_file = _get_entry(elem_old, struct filemgr, e);
                            old_file_refcount = atomic_get_uint32_t(&old_file->ref_count);
                        }
                    }

                    // If old file is opened by other handle, renaming should be
                    // postponed. It will be renamed later by the handle referring
                    // to the old file.
                    if (!elem && old_file_refcount == 0 &&
                        is_file_removed(orig_file_name)) {
                        // If background file removal is not done yet, we postpone
                        // file renaming at this time.
                        if (rename(file->filename, orig_file_name) < 0) {
                            // Note that the renaming failure is not a critical
                            // issue because the last compacted file will be automatically
                            // identified and opened in the next fdb_open call.
                            _log_errno_str(file->ops, log_callback, FDB_RESULT_FILE_RENAME_FAIL,
                                           "CLOSE", file->filename);
                        }
                    }
                }
                spin_unlock(&file->lock);
                // Clean up global hash table, WAL index, and buffer cache.
                struct hash_elem *ret = hash_remove(&hash, &file->e);
                fdb_assert(ret, file, 0);

                spin_unlock(&filemgr_openlock);

                filemgr_free_func(&file->e);
                return (fdb_status) rv;
            } else {
                atomic_store_uint8_t(&file->status, FILE_CLOSED);
            }
        }
    }

    _log_errno_str(file->ops, log_callback, (fdb_status)rv, "CLOSE", file->filename);

    spin_unlock(&file->lock);
    spin_unlock(&filemgr_openlock);
    return (fdb_status) rv;
}